

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

bool __thiscall World::PlayerOnline(World *this,string *username)

{
  byte bVar1;
  pointer pcVar2;
  EOServer *pEVar3;
  _List_node_base *p_Var4;
  int iVar5;
  ulong uVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  bool bVar9;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  pcVar2 = (username->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + username->_M_string_length);
  if (local_40 == 0) {
    bVar8 = true;
  }
  else {
    bVar8 = false;
    uVar6 = 1;
    do {
      bVar1 = *(byte *)((long)local_48 + (uVar6 - 1));
      if ((char)bVar1 < 'a') {
        if (bVar1 != 0x20 && 9 < (byte)(bVar1 - 0x30)) break;
      }
      else if (0x7a < bVar1) break;
      bVar8 = local_40 <= uVar6;
      bVar9 = uVar6 != local_40;
      uVar6 = uVar6 + 1;
    } while (bVar9);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (bVar8) {
    pEVar3 = this->server;
    for (p_Var7 = (pEVar3->super_Server).clients.
                  super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        p_Var7 != (_List_node_base *)&(pEVar3->super_Server).clients; p_Var7 = p_Var7->_M_next) {
      p_Var4 = *(_List_node_base **)((long)(p_Var7[1]._M_next + 0x10) + 8);
      if ((p_Var4 != (_List_node_base *)0x0) &&
         (iVar5 = std::__cxx11::string::compare((string *)(p_Var4 + 1)), iVar5 == 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool World::PlayerOnline(std::string username)
{
	if (!Player::ValidName(username))
	{
		return false;
	}

	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			if (eoclient->player->username.compare(username) == 0)
			{
				return true;
			}
		}
	}

	return false;
}